

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O1

bool __thiscall
__gnu_cxx::__ops::_Iter_less_val::operator()
          (_Iter_less_val *this,pair<crnlib::vec<6U,_float>,_unsigned_int> *__it,
          pair<crnlib::vec<6U,_float>,_unsigned_int> *__val)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  
  fVar1 = (__it->first).m_s[0];
  fVar2 = (__val->first).m_s[0];
  bVar5 = true;
  if (fVar2 <= fVar1) {
    if (fVar1 == fVar2) {
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        uVar7 = uVar6;
        if (uVar6 == 5) goto LAB_0017a553;
        fVar3 = (__it->first).m_s[uVar6 + 1];
        fVar4 = (__val->first).m_s[uVar6 + 1];
        if (fVar3 < fVar4) {
          uVar7 = 1;
          goto LAB_0017a553;
        }
        uVar7 = uVar6 + 1;
      } while (fVar3 == fVar4);
      uVar7 = 0;
LAB_0017a553:
      if ((uVar6 < 5 & (byte)uVar7) != 0) {
        return true;
      }
    }
    if (fVar1 <= fVar2) {
      if (fVar2 != fVar1) {
LAB_0017a59f:
        return __it->second < __val->second;
      }
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        uVar7 = uVar6;
        if (uVar6 == 5) goto LAB_0017a591;
        fVar1 = (__val->first).m_s[uVar6 + 1];
        fVar2 = (__it->first).m_s[uVar6 + 1];
        if (fVar1 < fVar2) {
          uVar7 = 1;
          goto LAB_0017a591;
        }
        uVar7 = uVar6 + 1;
      } while (fVar1 == fVar2);
      uVar7 = 0;
LAB_0017a591:
      if ((uVar6 < 5 & (byte)uVar7) == 0) goto LAB_0017a59f;
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

inline bool operator<(const vec& rhs) const {
    for (uint i = 0; i < N; i++) {
      if (m_s[i] < rhs.m_s[i])
        return true;
      else if (!(m_s[i] == rhs.m_s[i]))
        return false;
    }

    return false;
  }